

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
CGL::HDRImageBuffer::toColor
          (HDRImageBuffer *this,ImageBuffer *target,size_t x0,size_t y0,size_t x1,size_t y1)

{
  double *pdVar1;
  ulong in_RCX;
  ulong in_RDX;
  long *in_RDI;
  ulong in_R8;
  ulong in_R9;
  float b_00;
  double dVar2;
  float b;
  float g;
  float r;
  Vector3D *s;
  size_t x;
  size_t y;
  float exposure;
  float one_over_gamma;
  float level;
  float gamma;
  Color local_c4;
  double y_00;
  Color *c;
  undefined4 in_stack_ffffffffffffff60;
  double local_98;
  double local_90;
  double local_88;
  float local_7c;
  double local_78;
  double local_70;
  double local_68;
  float local_5c;
  reference local_58;
  ulong local_50;
  ulong local_48;
  float local_40;
  float local_3c;
  undefined4 local_38;
  undefined4 local_34;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  
  local_34 = 0x400ccccd;
  local_38 = 0x3f800000;
  local_3c = 0.45454544;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  dVar2 = pow(2.0,1.0);
  dVar2 = sqrt(dVar2);
  local_40 = (float)dVar2;
  for (local_48 = local_20; local_48 < local_30; local_48 = local_48 + 1) {
    for (local_50 = local_18; local_50 < local_28; local_50 = local_50 + 1) {
      local_58 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::operator[]
                           ((vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *)(in_RDI + 2),
                            local_50 + local_48 * *in_RDI);
      local_68 = 0.0;
      local_70 = pow((local_58->field_0).field_0.x * (double)local_40,(double)local_3c);
      local_78 = 1.0;
      pdVar1 = std::min<double>(&local_70,&local_78);
      pdVar1 = std::max<double>(&local_68,pdVar1);
      local_5c = (float)*pdVar1;
      local_88 = 0.0;
      local_90 = pow((local_58->field_0).field_0.y * (double)local_40,(double)local_3c);
      local_98 = 1.0;
      pdVar1 = std::min<double>(&local_90,&local_98);
      pdVar1 = std::max<double>(&local_88,pdVar1);
      local_7c = (float)*pdVar1;
      c = (Color *)0x0;
      dVar2 = pow((local_58->field_0).field_0.z * (double)local_40,(double)local_3c);
      y_00 = 1.0;
      pdVar1 = std::min<double>((double *)&stack0xffffffffffffff50,
                                (double *)&stack0xffffffffffffff48);
      pdVar1 = std::max<double>((double *)&stack0xffffffffffffff58,pdVar1);
      b_00 = (float)*pdVar1;
      Color::Color(&local_c4,local_5c,local_7c,b_00);
      ImageBuffer::update_pixel
                ((ImageBuffer *)CONCAT44(b_00,in_stack_ffffffffffffff60),c,(size_t)dVar2,
                 (size_t)y_00);
    }
  }
  return;
}

Assistant:

void toColor(ImageBuffer& target, size_t x0, size_t y0, size_t x1, size_t y1) {

    float gamma = 2.2f;
    float level = 1.0f;
    float one_over_gamma = 1.0f / gamma;
    float exposure = sqrt(pow(2,level));
    for (size_t y = y0; y < y1; ++y) {
      for (size_t x = x0; x < x1; ++x) {
        const Vector3D& s = data[x + y * w];
        float r = std::max(0.0, std::min(pow(s.r * exposure, one_over_gamma), 1.0));
        float g = std::max(0.0, std::min(pow(s.g * exposure, one_over_gamma), 1.0));
        float b = std::max(0.0, std::min(pow(s.b * exposure, one_over_gamma), 1.0));
        target.update_pixel(Color(r, g, b), x, y);
      }
    }
  }